

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O3

void __thiscall
QWidgetPrivate::getLayoutItemMargins(QWidgetPrivate *this,int *left,int *top,int *right,int *bottom)

{
  if (left != (int *)0x0) {
    *left = (int)this->leftLayoutItemMargin;
  }
  if (top != (int *)0x0) {
    *top = (int)this->topLayoutItemMargin;
  }
  if (right != (int *)0x0) {
    *right = (int)this->rightLayoutItemMargin;
  }
  if (bottom != (int *)0x0) {
    *bottom = (int)this->bottomLayoutItemMargin;
  }
  return;
}

Assistant:

void QWidgetPrivate::getLayoutItemMargins(int *left, int *top, int *right, int *bottom) const
{
    if (left)
        *left = (int)leftLayoutItemMargin;
    if (top)
        *top = (int)topLayoutItemMargin;
    if (right)
        *right = (int)rightLayoutItemMargin;
    if (bottom)
        *bottom = (int)bottomLayoutItemMargin;
}